

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O1

void helper_set_rounding_mode_riscv64(CPURISCVState_conflict2 *env,uint32_t rm)

{
  uintptr_t unaff_retaddr;
  
  if (rm == 7) {
    rm = (uint32_t)env->frm;
  }
  if (rm < 5) {
    (env->fp_status).float_rounding_mode = (char)(0x402010300 >> ((byte)(rm << 3) & 0x3f));
    return;
  }
  riscv_raise_exception_riscv64(env,2,unaff_retaddr);
}

Assistant:

void helper_set_rounding_mode(CPURISCVState *env, uint32_t rm)
{
    int softrm;

    if (rm == 7) {
        rm = env->frm;
    }
    switch (rm) {
    case 0:
        softrm = float_round_nearest_even;
        break;
    case 1:
        softrm = float_round_to_zero;
        break;
    case 2:
        softrm = float_round_down;
        break;
    case 3:
        softrm = float_round_up;
        break;
    case 4:
        softrm = float_round_ties_away;
        break;
    default:
        riscv_raise_exception(env, RISCV_EXCP_ILLEGAL_INST, GETPC());
    }

    set_float_rounding_mode(softrm, &env->fp_status);
}